

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IStreamingReporter * __thiscall
Catch::ReporterRegistry::create
          (ReporterRegistry *this,string *name,Ptr<const_Catch::IConfig> *config)

{
  long *plVar1;
  const_iterator cVar2;
  IStreamingReporter *pIVar3;
  ReporterConfig local_30;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
          ::find(&(this->m_factories)._M_t,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_factories)._M_t._M_impl.super__Rb_tree_header) {
    pIVar3 = (IStreamingReporter *)0x0;
  }
  else {
    plVar1 = *(long **)(cVar2._M_node + 2);
    ReporterConfig::ReporterConfig(&local_30,config);
    pIVar3 = (IStreamingReporter *)(**(code **)(*plVar1 + 0x20))(plVar1,&local_30);
    Ptr<const_Catch::IConfig>::~Ptr(&local_30.m_fullConfig);
  }
  return pIVar3;
}

Assistant:

virtual IStreamingReporter* create(std::string const& name, Ptr<IConfig const> const& config) const CATCH_OVERRIDE {
			FactoryMap::const_iterator it = m_factories.find(name);
			if (it == m_factories.end())
				return CATCH_NULL;
			return it->second->create(ReporterConfig(config));
		}